

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool dxil_spv::instruction_has_side_effects(Instruction *instruction)

{
  bool bVar1;
  int iVar2;
  CallInst *this;
  Function *this_00;
  String *this_01;
  char *__s1;
  Function *called_function;
  CallInst *call_inst;
  Instruction *instruction_local;
  
  bVar1 = LLVMBC::isa<LLVMBC::StoreInst>(&instruction->super_Value);
  if (((bVar1) || (bVar1 = LLVMBC::isa<LLVMBC::AtomicCmpXchgInst>(&instruction->super_Value), bVar1)
      ) || (bVar1 = LLVMBC::isa<LLVMBC::AtomicRMWInst>(&instruction->super_Value), bVar1)) {
    return true;
  }
  this = LLVMBC::dyn_cast<LLVMBC::CallInst>(&instruction->super_Value);
  if (this == (CallInst *)0x0) {
    return false;
  }
  this_00 = LLVMBC::CallInst::getCalledFunction(this);
  this_01 = LLVMBC::Function::getName_abi_cxx11_(this_00);
  __s1 = std::__cxx11::
         basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::data
                   (this_01);
  iVar2 = strncmp(__s1,"dx.op",5);
  if (iVar2 == 0) {
    bVar1 = dxil_instruction_has_side_effects(this);
    return bVar1;
  }
  return true;
}

Assistant:

static bool instruction_has_side_effects(const llvm::Instruction &instruction)
{
	if (llvm::isa<llvm::StoreInst>(&instruction) ||
	    llvm::isa<llvm::AtomicCmpXchgInst>(&instruction) ||
	    llvm::isa<llvm::AtomicRMWInst>(&instruction))
	{
		return true;
	}

	if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&instruction))
	{
		auto *called_function = call_inst->getCalledFunction();
		if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
			return dxil_instruction_has_side_effects(call_inst);
		else
			return true;
	}

	return false;
}